

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_id.cc
# Opt level: O0

char * __thiscall Env::RValue(Env *this,ID *id)

{
  bool bVar1;
  IDRecord *pIVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 in_RSI;
  ID *in_RDI;
  IDRecord *r;
  IDRecord *in_stack_ffffffffffffffd8;
  Env *in_stack_fffffffffffffff8;
  
  pIVar2 = lookup(in_stack_fffffffffffffff8,in_RDI,SUB81((ulong)in_RSI >> 0x38,0),
                  SUB81((ulong)in_RSI >> 0x30,0));
  if (pIVar2 == (IDRecord *)0x0) {
    bVar1 = allow_undefined_id((Env *)in_RDI);
    if (!bVar1) {
      uVar4 = __cxa_allocate_exception(0x28);
      ExceptionIDNotFound::ExceptionIDNotFound((ExceptionIDNotFound *)id,(ID *)r);
      __cxa_throw(uVar4,&ExceptionIDNotFound::typeinfo,ExceptionIDNotFound::~ExceptionIDNotFound);
    }
    pcVar3 = ID::Name((ID *)0x13eeb1);
  }
  else {
    pcVar3 = IDRecord::RValue(in_stack_ffffffffffffffd8);
  }
  return pcVar3;
}

Assistant:

const char* Env::RValue(const ID* id) const
	{
	IDRecord* r = lookup(id, true, false);
	if ( r )
		return r->RValue();
	else
		{
		if ( allow_undefined_id() )
			return id->Name();
		else
			throw ExceptionIDNotFound(id);
		}
	}